

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DirectionalLight>::transform
          (LightNodeImpl<embree::SceneGraph::DirectionalLight> *this,AffineSpace3fa *space)

{
  void *pvVar1;
  DirectionalLight *in_RSI;
  LightNodeImpl<embree::SceneGraph::DirectionalLight> *in_RDI;
  LightNodeImpl<embree::SceneGraph::DirectionalLight> *this_00;
  
  this_00 = in_RDI;
  pvVar1 = operator_new(0x172eea);
  DirectionalLight::transform(in_RSI,(AffineSpace3fa *)this_00);
  LightNodeImpl(this_00,(DirectionalLight *)in_RDI);
  *(void **)&(in_RDI->super_LightNode).super_Node.super_RefCount = pvVar1;
  if (*(long *)&(in_RDI->super_LightNode).super_Node.super_RefCount != 0) {
    (**(code **)(**(long **)&(in_RDI->super_LightNode).super_Node.super_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::LightNode>)&this_00->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }